

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Cluster::GetFirst(Cluster *this,BlockEntry **pFirst)

{
  BlockEntry *pBVar1;
  long lVar2;
  long len;
  longlong pos;
  long local_20;
  longlong local_18;
  
  if (this->m_entries_count < 1) {
    lVar2 = Parse(this,&local_18,&local_20);
    if (-1 < lVar2) {
      if (0 < this->m_entries_count) goto LAB_0012b404;
      lVar2 = 0;
    }
    *pFirst = (BlockEntry *)0x0;
  }
  else {
LAB_0012b404:
    if (this->m_entries == (BlockEntry **)0x0) {
      __assert_fail("m_entries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1cac,"long mkvparser::Cluster::GetFirst(const BlockEntry *&) const");
    }
    pBVar1 = *this->m_entries;
    *pFirst = pBVar1;
    if (pBVar1 == (BlockEntry *)0x0) {
      __assert_fail("pFirst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1caf,"long mkvparser::Cluster::GetFirst(const BlockEntry *&) const");
    }
    lVar2 = 0;
  }
  return lVar2;
}

Assistant:

long Cluster::GetFirst(const BlockEntry*& pFirst) const {
  if (m_entries_count <= 0) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pFirst = NULL;
      return status;
    }

    if (m_entries_count <= 0) {  // empty cluster
      pFirst = NULL;
      return 0;
    }
  }

  assert(m_entries);

  pFirst = m_entries[0];
  assert(pFirst);

  return 0;  // success
}